

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O0

VectorData *
find_max_min_mean<signed_char>
          (VectorData *__return_storage_ptr__,
          vector<signed_char,_std::allocator<signed_char>_> *numbers)

{
  double dVar1;
  bool bVar2;
  reference pcVar3;
  size_type sVar4;
  undefined1 auVar5 [16];
  VectorData *vd;
  char *local_28;
  double local_20;
  double sum;
  const_iterator it;
  vector<signed_char,_std::allocator<signed_char>_> *numbers_local;
  
  it._M_current = (char *)numbers;
  sum = (double)std::vector<signed_char,_std::allocator<signed_char>_>::begin(numbers);
  pcVar3 = __gnu_cxx::
           __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
           ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        *)&sum);
  __return_storage_ptr__->max = (double)(int)*pcVar3;
  pcVar3 = __gnu_cxx::
           __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
           ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        *)&sum);
  __return_storage_ptr__->min = (double)(int)*pcVar3;
  pcVar3 = __gnu_cxx::
           __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
           ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                        *)&sum);
  local_20 = (double)(int)*pcVar3;
  sVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)it._M_current);
  if (sVar4 == 1) {
    __return_storage_ptr__->mean = __return_storage_ptr__->max;
    __return_storage_ptr__->min = __return_storage_ptr__->max;
  }
  else {
    local_28 = (char *)__gnu_cxx::
                       __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                       ::operator+((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                                    *)&sum,1);
    sum = (double)local_28;
    while( true ) {
      vd = (VectorData *)
           std::vector<signed_char,_std::allocator<signed_char>_>::end
                     ((vector<signed_char,_std::allocator<signed_char>_> *)it._M_current);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                          *)&sum,(__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                                  *)&vd);
      dVar1 = local_20;
      if (!bVar2) break;
      dVar1 = __return_storage_ptr__->max;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
               ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                            *)&sum);
      if (dVar1 < (double)(int)*pcVar3) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                 ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                              *)&sum);
        __return_storage_ptr__->max = (double)(int)*pcVar3;
      }
      dVar1 = __return_storage_ptr__->min;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
               ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                            *)&sum);
      if ((double)(int)*pcVar3 < dVar1) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                 ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                              *)&sum);
        __return_storage_ptr__->min = (double)(int)*pcVar3;
      }
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
               ::operator*((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                            *)&sum);
      local_20 = (double)(int)*pcVar3 + local_20;
      __gnu_cxx::
      __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
      ::operator++((__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                    *)&sum);
    }
    sVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)it._M_current);
    auVar5._8_4_ = (int)(sVar4 >> 0x20);
    auVar5._0_8_ = sVar4;
    auVar5._12_4_ = 0x45300000;
    __return_storage_ptr__->mean =
         dVar1 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  }
  return __return_storage_ptr__;
}

Assistant:

VectorData find_max_min_mean(const std::vector<Number>& numbers)
{
	VectorData vd;

	auto it = numbers.begin();
	vd.max = *it;
	vd.min = *it;
	double sum = *it;

	if (numbers.size() == 1)
	{
		vd.min = vd.mean = vd.max;
		return vd;
	}

	for (it = it + 1; it != numbers.end(); ++it)
	{
		if (vd.max < *it)
			vd.max = *it;
		if (vd.min > * it)
			vd.min = *it;
		sum += *it;
	}

	vd.mean = sum / numbers.size();
	return vd;
}